

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O0

char ** str_split(char *str,char *delim,int *elts)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int *in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t memsize;
  char *tmp;
  int argc;
  char **argv;
  char **ap;
  char *p1;
  size_t in_stack_ffffffffffffffa0;
  char **__dest;
  char **local_48;
  int local_3c;
  char **local_38;
  char **local_30;
  char *local_28;
  int *local_20;
  char *local_18;
  char *local_10;
  char **local_8;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) {
    local_8 = (char **)0x0;
  }
  else {
    local_3c = 1;
    local_28 = in_RDI;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    do {
      local_28 = strpbrk(local_28,local_18);
      if (local_28 == (char *)0x0) break;
      local_28 = local_28 + 1;
      local_3c = local_3c + 1;
    } while (*local_28 != '\0');
    iVar1 = local_3c + 1;
    sVar2 = strlen(local_10);
    local_38 = (char **)zt_malloc_p(in_stack_ffffffffffffffa0);
    memset(local_38,0,(long)iVar1 * 8 + sVar2 + 1);
    __dest = local_38 + (local_3c + 1);
    local_48 = __dest;
    sVar2 = strlen(local_10);
    strncpy((char *)__dest,local_10,sVar2);
    *local_20 = local_3c;
    local_30 = local_38;
    do {
      do {
        pcVar3 = strsep((char **)&local_48,local_18);
        *local_30 = pcVar3;
        if (pcVar3 == (char *)0x0) goto LAB_0013abce;
      } while (**local_30 == '\0');
      local_30 = local_30 + 1;
      local_3c = local_3c + -1;
    } while (0 < local_3c);
LAB_0013abce:
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

char **str_split(char *str, char * delim, int *elts)
{
    char * p1;
    char **ap;
    char **argv;
    int    argc;
    char * tmp;
    size_t memsize;

    if (str == NULL || delim == NULL) {
        return NULL;
    }

    argc = 1;
    p1 = str;
    while ((p1 = strpbrk(p1, delim)) != NULL) {
        ++p1;
        argc += 1;
        if (*p1 == '\0') {
            break;
        }
    }

    /* calculate the size of the char *vector then add the string to
     * the end of that (includeing null space for the empty vector
     * spot and the NUL char
     */
    memsize = (sizeof(char *) * (argc + 1)) + (sizeof(char) * (strlen(str) + 1));

    argv = (char **)zt_malloc(char, memsize);
    memset(argv, '\0', memsize);

    tmp = (char *)argv + (sizeof(char *) * (argc + 1));
    strncpy(tmp, str, strlen(str));

    *elts = argc;

    for (ap = argv; (*ap = strsep(&tmp, delim)) != NULL; ) {
        if (**ap != '\0') {
            ++ap;
            if (--argc <= 0) {
                break;
            }
        }
    }

    return argv;
}